

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_network.cpp
# Opt level: O0

void __thiscall sensors_analytics::Connection::~Connection(Connection *this)

{
  Connection *this_local;
  
  if (this->curl_handle_ != (CURL *)0x0) {
    curl_easy_cleanup(this->curl_handle_);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->header_fields_);
  std::__cxx11::string::~string((string *)&this->base_url_);
  return;
}

Assistant:

Connection::~Connection() {
  if (this->curl_handle_) {
    curl_easy_cleanup(this->curl_handle_);
  }
}